

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall
QMetaPropertyBuilderPrivate::~QMetaPropertyBuilderPrivate(QMetaPropertyBuilderPrivate *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->type).d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

QMetaPropertyBuilderPrivate
            (const QByteArray& _name, const QByteArray& _type, QMetaType _metaType, int notifierIdx=-1,
             int _revision = 0)
        : name(_name),
          type(QMetaObject::normalizedType(_type.constData())),
          metaType(_metaType),
          flags(Readable | Writable | Scriptable), notifySignal(notifierIdx),
          revision(_revision)
    {

    }